

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O3

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
          (ScriptContextOptimizationOverrideInfo *this,SideEffects se)

{
  code *pcVar1;
  bool bVar2;
  SideEffects SVar3;
  undefined4 *puVar4;
  ScriptContextOptimizationOverrideInfo *pSVar5;
  
  if (this->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
    this->sideEffects = this->sideEffects | se;
  }
  else if ((se & ~this->sideEffects) != SideEffects_None) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pSVar5 = this;
    do {
      SVar3 = pSVar5->sideEffects;
      if ((se & ~SVar3) == SideEffects_None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0xaf,"((info->sideEffects & se) != se)",
                                    "(info->sideEffects & se) != se");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        SVar3 = pSVar5->sideEffects;
      }
      pSVar5->sideEffects = SVar3 | se;
      pSVar5 = pSVar5->crossSiteNext;
    } while (pSVar5 != this);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::SetSideEffects(SideEffects se)
{
    if (this->crossSiteRoot == nullptr)
    {
        sideEffects = (SideEffects)(sideEffects | se);
    }
    else if ((sideEffects & se) != se)
    {
        ForEachCrossSiteInfo([se](ScriptContextOptimizationOverrideInfo * info)
        {
            Assert((info->sideEffects & se) != se);
            info->sideEffects = (SideEffects)(info->sideEffects | se);
        });
    }
}